

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

QRhiShaderResourceBinding *
QRhiShaderResourceBinding::sampledTextures
          (int binding,StageFlags stage,int count,TextureAndSampler *texSamplers)

{
  long lVar1;
  undefined8 *puVar2;
  int in_ECX;
  undefined8 *puVar3;
  Int in_EDX;
  int in_ESI;
  QRhiShaderResourceBinding *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  QRhiShaderResourceBinding *b;
  int i;
  int local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(in_RDI,0xaa,0x118);
  QRhiShaderResourceBinding((QRhiShaderResourceBinding *)0x69210c);
  (in_RDI->d).binding = in_ESI;
  (in_RDI->d).stage.super_QFlagsStorageHelper<QRhiShaderResourceBinding::StageFlag,_4>.
  super_QFlagsStorage<QRhiShaderResourceBinding::StageFlag>.i = in_EDX;
  (in_RDI->d).type = SampledTexture;
  (in_RDI->d).u.stex.count = in_ECX;
  for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
    if (in_R8 == 0) {
      puVar2 = (undefined8 *)((long)&(in_RDI->d).u + (long)local_34 * 0x10 + 8);
      *puVar2 = 0;
      puVar2[1] = 0;
    }
    else {
      puVar3 = (undefined8 *)(in_R8 + (long)local_34 * 0x10);
      puVar2 = (undefined8 *)((long)&(in_RDI->d).u + (long)local_34 * 0x10 + 8);
      *puVar2 = *puVar3;
      puVar2[1] = puVar3[1];
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRhiShaderResourceBinding QRhiShaderResourceBinding::sampledTextures(
        int binding, StageFlags stage, int count, const TextureAndSampler *texSamplers)
{
    Q_ASSERT(count >= 1 && count <= Data::MAX_TEX_SAMPLER_ARRAY_SIZE);
    QRhiShaderResourceBinding b;
    b.d.binding = binding;
    b.d.stage = stage;
    b.d.type = SampledTexture;
    b.d.u.stex.count = count;
    for (int i = 0; i < count; ++i) {
        if (texSamplers)
            b.d.u.stex.texSamplers[i] = texSamplers[i];
        else
            b.d.u.stex.texSamplers[i] = { nullptr, nullptr };
    }
    return b;
}